

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::RowSingletonPS::RowSingletonPS
          (RowSingletonPS *this,SPxLPBase<double> *lp,int _i,int _j,bool strictLo,bool strictUp,
          double newLo,double newUp,double oldLo,double oldUp,shared_ptr<soplex::Tolerances> *tols)

{
  double dVar1;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  PostStep::PostStep(&this->super_PostStep,"RowSingleton",
                     (shared_ptr<soplex::Tolerances> *)&local_40,
                     (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,
                     (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__RowSingletonPS_0053e4f8;
  this->m_i = _i;
  this->m_old_i = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  this->m_j = _j;
  this->m_lhs = (lp->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[_i];
  this->m_rhs = (lp->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[_i];
  this->m_strictLo = strictLo;
  this->m_strictUp = strictUp;
  this->m_maxSense = lp->thesense == MAXIMIZE;
  this->m_obj = -(lp->super_LPColSetBase<double>).object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[_j];
  DSVectorBase<double>::DSVectorBase<double>
            (&this->m_col,
             (SVectorBase<double> *)
             ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx));
  this->m_newLo = newLo;
  this->m_newUp = newUp;
  this->m_oldLo = oldLo;
  this->m_oldUp = oldUp;
  dVar1 = (lp->super_LPRowSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[_i];
  if (lp->thesense == MINIMIZE) {
    dVar1 = -dVar1;
  }
  this->m_row_obj = dVar1;
  return;
}

Assistant:

RowSingletonPS(const SPxLPBase<R>& lp, int _i, int _j, bool strictLo, bool strictUp,
                     R newLo, R newUp, R oldLo, R oldUp, std::shared_ptr<Tolerances> tols)
         : PostStep("RowSingleton", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_j(_j)
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_strictLo(strictLo)
         , m_strictUp(strictUp)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_col(lp.colVector(_j))
         , m_newLo(newLo)
         , m_newUp(newUp)
         , m_oldLo(oldLo)
         , m_oldUp(oldUp)
         , m_row_obj(lp.rowObj(_i))
      {}